

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O0

void __thiscall catalog::print(catalog *this)

{
  key_type kVar1;
  ostream *poVar2;
  reference ppTVar3;
  void *this_00;
  reference pvVar4;
  reference pvVar5;
  pointer ppVar6;
  _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  key_type local_18;
  int local_14;
  int j;
  int i;
  catalog *this_local;
  
  _j = this;
  for (local_14 = 0; local_14 < this->tableNumber; local_14 = local_14 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"tableName : ");
    ppTVar3 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&this->TableInfoList,(long)local_14);
    std::operator<<(poVar2,(string *)*ppTVar3);
    poVar2 = std::operator<<((ostream *)&std::cout,"\tattributeNum : ");
    ppTVar3 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&this->TableInfoList,(long)local_14);
    this_00 = (void *)std::ostream::operator<<(poVar2,(*ppTVar3)->attributeNum);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_18 = 0;
    while( true ) {
      kVar1 = local_18;
      ppTVar3 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_14);
      if ((*ppTVar3)->attributeNum <= kVar1) break;
      ppTVar3 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_14);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&(*ppTVar3)->attributeName,(long)local_18);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)pvVar4);
      poVar2 = std::operator<<(poVar2,"\t");
      ppTVar3 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_14);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppTVar3)->type,(long)local_18);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar5);
      poVar2 = std::operator<<(poVar2,"\t");
      ppTVar3 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_14);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(*ppTVar3)->constraint,(long)local_18);
      std::ostream::operator<<(poVar2,*pvVar5);
      ppTVar3 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_14);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(*ppTVar3)->constraint,(long)local_18);
      if (*pvVar5 == 3) {
        std::operator<<((ostream *)&std::cout,"\tprimary key ");
      }
      ppTVar3 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_14);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(*ppTVar3)->constraint,(long)local_18);
      if (*pvVar5 == 4) {
        poVar2 = std::operator<<((ostream *)&std::cout,"\tindex ");
        ppTVar3 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                            (&this->TableInfoList,(long)local_14);
        local_20._M_node =
             (_Base_ptr)
             std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&(*ppTVar3)->indexInfo,&local_18);
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_20);
        std::operator<<(poVar2,(string *)&ppVar6->second);
      }
      std::operator<<((ostream *)&std::cout,"\n");
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

void catalog::print(){
    for(int i = 0 ; i < tableNumber ; i ++){
        std::cout<<"tableName : "<<TableInfoList[i]->tableName;
        std::cout<<"\tattributeNum : "<<TableInfoList[i]->attributeNum<<std::endl;
        for(int j = 0 ; j < TableInfoList[i]->attributeNum; j ++){
            std::cout<<TableInfoList[i]->attributeName[j] << "\t"<<TableInfoList[i]->type[j] << "\t"<<TableInfoList[i]->constraint[j];
            if(TableInfoList[i]->constraint[j] == 3)std::cout<<"\tprimary key ";
            if(TableInfoList[i]->constraint[j] == 4)std::cout<<"\tindex "<<TableInfoList[i]->indexInfo.find(j)->second;
            std::cout<<"\n";
        }
        //std::cout <<"file_offset :"<<file_offset[i]<<std::endl;
    }
}